

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::queryTextureParamState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,GLenum pname
               ,QueriedState *state)

{
  bool bVar1;
  float *pfVar2;
  int *piVar3;
  uint *puVar4;
  float (*pafVar5) [4];
  int (*paiVar6) [4];
  uint (*pauVar7) [4];
  QueriedState local_270;
  undefined1 local_248 [8];
  StateQueryMemoryWriteGuard<unsigned_int[4]> value_7;
  undefined1 local_1f0 [8];
  StateQueryMemoryWriteGuard<int[4]> value_6;
  undefined1 local_198 [8];
  StateQueryMemoryWriteGuard<float[4]> value_5;
  undefined1 local_140 [8];
  StateQueryMemoryWriteGuard<int[4]> value_4;
  undefined1 local_e4 [8];
  StateQueryMemoryWriteGuard<unsigned_int> value_3;
  undefined1 local_ac [8];
  StateQueryMemoryWriteGuard<int> value_2;
  undefined1 local_74 [8];
  StateQueryMemoryWriteGuard<float> value_1;
  undefined1 local_3c [8];
  StateQueryMemoryWriteGuard<int> value;
  QueriedState *state_local;
  GLenum pname_local;
  GLenum target_local;
  QueryType type_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  value._4_8_ = state;
  switch(type) {
  case QUERY_TEXTURE_PARAM_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_3c);
    piVar3 = StateQueryMemoryWriteGuard<int>::operator&((StateQueryMemoryWriteGuard<int> *)local_3c)
    ;
    glu::CallLogWrapper::glGetTexParameteriv(gl,target,pname,piVar3);
    bVar1 = checkError(result,gl,"glGetTexParameteriv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_3c,result), bVar1)) {
      piVar3 = StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_3c);
      QueriedState::QueriedState((QueriedState *)&value_1.m_value,*piVar3);
      memcpy((void *)value._4_8_,&value_1.m_value,0x28);
    }
    break;
  case QUERY_TEXTURE_PARAM_FLOAT:
    StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<float> *)local_74);
    pfVar2 = StateQueryMemoryWriteGuard<float>::operator&
                       ((StateQueryMemoryWriteGuard<float> *)local_74);
    glu::CallLogWrapper::glGetTexParameterfv(gl,target,pname,pfVar2);
    bVar1 = checkError(result,gl,"glGetTexParameterfv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<float>::verifyValidity
                          ((StateQueryMemoryWriteGuard<float> *)local_74,result), bVar1)) {
      pfVar2 = StateQueryMemoryWriteGuard::operator_cast_to_float_
                         ((StateQueryMemoryWriteGuard *)local_74);
      QueriedState::QueriedState((QueriedState *)&value_2.m_value,*pfVar2);
      memcpy((void *)value._4_8_,&value_2.m_value,0x28);
    }
    break;
  case QUERY_TEXTURE_PARAM_PURE_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_ac);
    piVar3 = StateQueryMemoryWriteGuard<int>::operator&((StateQueryMemoryWriteGuard<int> *)local_ac)
    ;
    glu::CallLogWrapper::glGetTexParameterIiv(gl,target,pname,piVar3);
    bVar1 = checkError(result,gl,"GetTexParameterIiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_ac,result), bVar1)) {
      piVar3 = StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_ac);
      QueriedState::QueriedState((QueriedState *)&value_3.m_value,*piVar3);
      memcpy((void *)value._4_8_,&value_3.m_value,0x28);
    }
    break;
  case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER:
    StateQueryMemoryWriteGuard<unsigned_int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<unsigned_int> *)local_e4);
    puVar4 = StateQueryMemoryWriteGuard<unsigned_int>::operator&
                       ((StateQueryMemoryWriteGuard<unsigned_int> *)local_e4);
    glu::CallLogWrapper::glGetTexParameterIuiv(gl,target,pname,puVar4);
    bVar1 = checkError(result,gl,"GetTexParameterIuiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<unsigned_int> *)local_e4,result), bVar1)) {
      puVar4 = StateQueryMemoryWriteGuard::operator_cast_to_unsigned_int_
                         ((StateQueryMemoryWriteGuard *)local_e4);
      QueriedState::QueriedState((QueriedState *)(value_4.m_postguard + 2),*puVar4);
      memcpy((void *)value._4_8_,value_4.m_postguard + 2,0x28);
    }
    break;
  case QUERY_TEXTURE_PARAM_INTEGER_VEC4:
    StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int[4]> *)local_140);
    paiVar6 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)local_140);
    glu::CallLogWrapper::glGetTexParameteriv(gl,target,pname,*paiVar6);
    bVar1 = checkError(result,gl,"glGetTexParameteriv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int[4]> *)local_140,result), bVar1)) {
      paiVar6 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)local_140);
      QueriedState::QueriedState((QueriedState *)(value_5.m_postguard + 2),(GLIntVec4 *)paiVar6);
      memcpy((void *)value._4_8_,value_5.m_postguard + 2,0x28);
    }
    break;
  case QUERY_TEXTURE_PARAM_FLOAT_VEC4:
    StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<float[4]> *)local_198);
    pafVar5 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)local_198);
    glu::CallLogWrapper::glGetTexParameterfv(gl,target,pname,*pafVar5);
    bVar1 = checkError(result,gl,"glGetTexParameterfv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<float[4]> *)local_198,result), bVar1)) {
      pafVar5 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)local_198);
      QueriedState::QueriedState((QueriedState *)(value_6.m_postguard + 2),(GLFloatVec4 *)pafVar5);
      memcpy((void *)value._4_8_,value_6.m_postguard + 2,0x28);
    }
    break;
  case QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4:
    StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int[4]> *)local_1f0);
    paiVar6 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)local_1f0);
    glu::CallLogWrapper::glGetTexParameterIiv(gl,target,pname,*paiVar6);
    bVar1 = checkError(result,gl,"GetTexParameterIiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int[4]> *)local_1f0,result), bVar1)) {
      paiVar6 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)local_1f0);
      QueriedState::QueriedState((QueriedState *)(value_7.m_postguard + 2),(GLIntVec4 *)paiVar6);
      memcpy((void *)value._4_8_,value_7.m_postguard + 2,0x28);
    }
    break;
  case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4:
    StateQueryMemoryWriteGuard<unsigned_int[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<unsigned_int[4]> *)local_248);
    pauVar7 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)local_248);
    glu::CallLogWrapper::glGetTexParameterIuiv(gl,target,pname,*pauVar7);
    bVar1 = checkError(result,gl,"GetTexParameterIuiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<unsigned_int[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<unsigned_int[4]> *)local_248,result), bVar1))
    {
      pauVar7 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)local_248);
      QueriedState::QueriedState(&local_270,(GLUintVec4 *)pauVar7);
      memcpy((void *)value._4_8_,&local_270,0x28);
    }
  }
  return;
}

Assistant:

void queryTextureParamState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_TEXTURE_PARAM_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetTexParameteriv(target, pname, &value);

			if (!checkError(result, gl, "glGetTexParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetTexParameterfv(target, pname, &value);

			if (!checkError(result, gl, "glGetTexParameterfv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_PURE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetTexParameterIiv(target, pname, &value);

			if (!checkError(result, gl, "GetTexParameterIiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLuint> value;
			gl.glGetTexParameterIuiv(target, pname, &value);

			if (!checkError(result, gl, "GetTexParameterIuiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetTexParameteriv(target, pname, value);

			if (!checkError(result, gl, "glGetTexParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_FLOAT_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat[4]> value;
			gl.glGetTexParameterfv(target, pname, value);

			if (!checkError(result, gl, "glGetTexParameterfv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetTexParameterIiv(target, pname, value);

			if (!checkError(result, gl, "GetTexParameterIiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLuint[4]> value;
			gl.glGetTexParameterIuiv(target, pname, value);

			if (!checkError(result, gl, "GetTexParameterIuiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}